

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::read_sources_from_object_file(CTcGenTarg *this,CVmFile *fp)

{
  uint uVar1;
  uint uVar2;
  CTcTokenizer *in_RSI;
  char fname [4096];
  size_t len;
  uint i;
  uint cnt;
  char *in_stack_ffffffffffffefc8;
  CTcTokenizer *in_stack_ffffffffffffefd0;
  char *in_stack_ffffffffffffefd8;
  CVmFile *in_stack_ffffffffffffefe0;
  undefined4 local_18;
  
  uVar1 = CVmFile::read_uint2((CVmFile *)in_stack_ffffffffffffefd0);
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    uVar2 = CVmFile::read_uint2((CVmFile *)in_stack_ffffffffffffefd0);
    if (uVar2 < 0x1001) {
      CVmFile::read_bytes(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,
                          (size_t)in_stack_ffffffffffffefd0);
    }
    else {
      CVmFile::read_bytes(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,
                          (size_t)in_stack_ffffffffffffefd0);
      in_stack_ffffffffffffefd0 = in_RSI;
      CVmFile::get_pos((CVmFile *)in_RSI);
      CVmFile::set_pos((CVmFile *)in_stack_ffffffffffffefd0,(long)in_stack_ffffffffffffefc8);
    }
    CTcTokenizer::create_file_desc(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,0x220c40);
  }
  return;
}

Assistant:

void CTcGenTarg::read_sources_from_object_file(CVmFile *fp)
{
    uint cnt;
    uint i;

    /* read the number of entries */
    cnt = fp->read_uint2();

    /* read the entries */
    for (i = 0 ; i < cnt ; ++i)
    {
        size_t len;
        char fname[OSFNMAX];

        /* read the length of the entry */
        len = fp->read_uint2();

        /* see if it fits in our buffer */
        if (len <= sizeof(fname))
        {
            /* read it */
            fp->read_bytes(fname, len);
        }
        else
        {
            /* it's too long - truncate to the buffer size */
            fp->read_bytes(fname, sizeof(fname));

            /* skip the rest */
            fp->set_pos(fp->get_pos() + len - sizeof(fname));

            /* note the truncated length */
            len = sizeof(fname);
        }

        /* 
         *   Add it to the tokenizer list.  Always create a new entry,
         *   rather than re-using an existing entry.  When loading
         *   multiple object files, this might result in the same file
         *   appearing as multiple different descriptors, but it's a small
         *   price to pay (it doesn't add too much redundant space to the
         *   image file, and in any case the information is only retained
         *   when we're compiling for debugging) for a big gain in
         *   simplicity (the source references in the object file can be
         *   fixed up simply by adding the object file's base index to all
         *   of the reference indices).  
         */
        G_tok->create_file_desc(fname, len);
    }
}